

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  long *plVar1;
  long lVar2;
  Action *action;
  anon_union_8_2_516a9242_for_ActionResult_2 *paVar3;
  char *in_R8;
  long *plVar4;
  ActionResult AVar5;
  ScriptValidator validator;
  ScriptValidator local_2f8;
  Expectation *local_2d8;
  Validator local_2d0;
  
  local_2f8.result_.enum_ = Ok;
  plVar4 = *(long **)script;
  plVar1 = *(long **)&script->field_0x8;
  local_2f8.options_ = options;
  local_2f8.errors_ = errors;
  local_2f8.script_ = script;
  if (plVar4 == plVar1) {
    local_2f8.result_.enum_ = Ok;
  }
  else {
    do {
      lVar2 = *plVar4;
      switch(*(undefined4 *)(lVar2 + 8)) {
      case 0:
      case 1:
        local_2d0.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0017c3d8;
        local_2d0.options_ = local_2f8.options_;
        local_2d0.errors_ = local_2f8.errors_;
        SharedValidator::SharedValidator(&local_2d0.validator_,local_2f8.errors_,local_2f8.options_)
        ;
        local_2d0.result_.enum_ = Ok;
        local_2d0.current_module_ = (Module *)(lVar2 + 0x10);
        anon_unknown_4::Validator::CheckModule(&local_2d0);
        local_2d0.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0017c3d8;
        SharedValidator::~SharedValidator(&local_2d0.validator_);
        break;
      case 2:
      case 9:
      case 10:
      case 0xb:
        anon_unknown_4::ScriptValidator::CheckAction(&local_2f8,*(Action **)(lVar2 + 0x10));
        break;
      case 8:
        action = *(Action **)(lVar2 + 0x10);
        AVar5 = anon_unknown_4::ScriptValidator::CheckAction(&local_2f8,action);
        if (AVar5.kind == Type) {
          local_2d8 = *(Expectation **)(lVar2 + 0x18);
          paVar3 = (anon_union_8_2_516a9242_for_ActionResult_2 *)operator_new(8);
          local_2d0.options_ = (ValidateOptions *)(paVar3 + 1);
          paVar3->types = (TypeVector *)AVar5.field_1;
          local_2d0.super_Delegate._vptr_Delegate = (_func_int **)paVar3;
          local_2d0.errors_ = (Errors *)local_2d0.options_;
          anon_unknown_4::ScriptValidator::CheckExpectationTypes
                    (&local_2f8,(Location *)(action + 8),(TypeVector *)&local_2d0,local_2d8,in_R8);
          operator_delete(paVar3,8);
        }
        else if (AVar5.kind == Types) {
          anon_unknown_4::ScriptValidator::CheckExpectationTypes
                    (&local_2f8,(Location *)(action + 8),AVar5.field_1.types,
                     *(Expectation **)(lVar2 + 0x18),in_R8);
        }
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != plVar1);
  }
  return (Result)local_2f8.result_.enum_;
}

Assistant:

ScriptValidator::ScriptValidator(Errors* errors,
                                 const Script* script,
                                 const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {}